

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

void cio_random_get_bytes(cio_rng_t *rng,void *bytes,size_t num_bytes)

{
  ulong uVar1;
  size_t sVar2;
  byte bVar3;
  uint8_t *dest;
  uint uVar4;
  
  if (num_bytes != 0) {
    sVar2 = 0;
    do {
      uVar1 = rng->state;
      uVar4 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
      bVar3 = (byte)(uVar1 >> 0x3b);
      rng->state = uVar1 * 0x5851f42d4c957f2d + rng->inc;
      *(byte *)((long)bytes + sVar2) = (byte)(uVar4 >> bVar3) | (byte)(uVar4 << 0x20 - bVar3);
      sVar2 = sVar2 + 1;
    } while (num_bytes != sVar2);
  }
  return;
}

Assistant:

void cio_random_get_bytes(cio_rng_t *rng, void *bytes, size_t num_bytes)
{
	uint8_t *dest = bytes;
	for (size_t i = 0; i < num_bytes; i++) {
		*dest = (uint8_t)pcg32_random_r(rng);
		dest++;
	}
}